

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tty.c
# Opt level: O1

int run_test_tty_file(void)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined1 *puVar4;
  undefined1 *unaff_RBX;
  uv_tty_t tty;
  uv_tty_t tty_wo;
  uv_tty_t tty_ro;
  uv_loop_t loop;
  uint uStack_ce8;
  uint uStack_ce4;
  undefined1 auStack_ce0 [8];
  undefined1 auStack_cd8 [90];
  byte bStack_c7e;
  undefined1 auStack_ba0 [90];
  byte bStack_b46;
  undefined1 auStack_a68 [848];
  undefined1 *puStack_718;
  undefined1 local_700 [312];
  undefined1 local_5c8 [312];
  undefined1 local_490 [312];
  undefined1 local_358 [848];
  
  iVar1 = uv_loop_init(local_358);
  if (iVar1 == 0) {
    uVar2 = open64("test/fixtures/empty_file",0);
    if (uVar2 != 0xffffffff) {
      unaff_RBX = (undefined1 *)(ulong)uVar2;
      iVar1 = uv_tty_init(local_358,local_700,uVar2,1);
      if (iVar1 != -0x16) goto LAB_001861d5;
      iVar1 = close(uVar2);
      if (iVar1 != 0) goto LAB_001861da;
      iVar1 = uv_tty_init(local_358,local_700,uVar2,1);
      if (iVar1 == -0x16) goto LAB_00185ec8;
      goto LAB_001861e4;
    }
LAB_00185ec8:
    uVar2 = open64("/dev/random",0);
    if (uVar2 != 0xffffffff) {
      unaff_RBX = (undefined1 *)(ulong)uVar2;
      iVar1 = uv_tty_init(local_358,local_700,uVar2,1);
      if (iVar1 != -0x16) goto LAB_001861df;
      iVar1 = close(uVar2);
      if (iVar1 == 0) goto LAB_00185f10;
      goto LAB_001861e9;
    }
LAB_00185f10:
    uVar2 = open64("/dev/zero",0);
    if (uVar2 != 0xffffffff) {
      unaff_RBX = (undefined1 *)(ulong)uVar2;
      iVar1 = uv_tty_init(local_358,local_700,uVar2,1);
      if (iVar1 != -0x16) goto LAB_001861ee;
      iVar1 = close(uVar2);
      if (iVar1 == 0) goto LAB_00185f58;
      goto LAB_001861f3;
    }
LAB_00185f58:
    uVar2 = open64("/dev/tty",2);
    if (uVar2 != 0xffffffff) {
      unaff_RBX = (undefined1 *)(ulong)uVar2;
      iVar1 = uv_tty_init(local_358,local_700,uVar2,1);
      if (iVar1 != 0) goto LAB_001861f8;
      iVar1 = close(uVar2);
      if (iVar1 != 0) goto LAB_001861fd;
      iVar1 = uv_is_readable(local_700);
      if (iVar1 == 0) goto LAB_00186202;
      iVar1 = uv_is_writable(local_700);
      if (iVar1 == 0) goto LAB_00186207;
      unaff_RBX = local_700;
      uv_close(unaff_RBX);
      iVar1 = uv_is_readable(unaff_RBX);
      if (iVar1 != 0) goto LAB_00186211;
      iVar1 = uv_is_writable(local_700);
      if (iVar1 == 0) goto LAB_00185ffb;
      goto LAB_0018621b;
    }
LAB_00185ffb:
    uVar2 = open64("/dev/tty",0);
    if (uVar2 != 0xffffffff) {
      unaff_RBX = (undefined1 *)(ulong)uVar2;
      iVar1 = uv_tty_init(local_358,local_490,uVar2,1);
      if (iVar1 != 0) goto LAB_0018620c;
      iVar1 = close(uVar2);
      if (iVar1 != 0) goto LAB_00186216;
      iVar1 = uv_is_readable(local_490);
      if (iVar1 == 0) goto LAB_00186220;
      iVar1 = uv_is_writable(local_490);
      if (iVar1 != 0) goto LAB_00186225;
      unaff_RBX = local_490;
      uv_close(unaff_RBX,0);
      iVar1 = uv_is_readable(unaff_RBX);
      if (iVar1 != 0) goto LAB_0018622f;
      iVar1 = uv_is_writable(local_490);
      if (iVar1 == 0) goto LAB_001860aa;
      goto LAB_00186239;
    }
LAB_001860aa:
    uVar2 = open64("/dev/tty",1);
    if (uVar2 == 0xffffffff) {
LAB_00186159:
      iVar1 = uv_run(local_358,0);
      if (iVar1 != 0) goto LAB_001861c6;
      iVar1 = uv_loop_close(local_358);
      if (iVar1 != 0) goto LAB_001861cb;
      unaff_RBX = (undefined1 *)uv_default_loop();
      uv_walk(unaff_RBX,close_walk_cb,0);
      uv_run(unaff_RBX,0);
      uVar3 = uv_default_loop();
      iVar1 = uv_loop_close(uVar3);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001861d0;
    }
    unaff_RBX = (undefined1 *)(ulong)uVar2;
    iVar1 = uv_tty_init(local_358,local_5c8,uVar2,0);
    if (iVar1 != 0) goto LAB_0018622a;
    iVar1 = close(uVar2);
    if (iVar1 != 0) goto LAB_00186234;
    iVar1 = uv_is_readable(local_5c8);
    if (iVar1 != 0) goto LAB_0018623e;
    iVar1 = uv_is_writable(local_5c8);
    if (iVar1 == 0) goto LAB_00186243;
    unaff_RBX = local_5c8;
    uv_close(unaff_RBX,0);
    iVar1 = uv_is_readable(unaff_RBX);
    if (iVar1 != 0) goto LAB_00186248;
    iVar1 = uv_is_writable(local_5c8);
    if (iVar1 == 0) goto LAB_00186159;
  }
  else {
    run_test_tty_file_cold_1();
LAB_001861c6:
    run_test_tty_file_cold_27();
LAB_001861cb:
    run_test_tty_file_cold_28();
LAB_001861d0:
    run_test_tty_file_cold_29();
LAB_001861d5:
    run_test_tty_file_cold_2();
LAB_001861da:
    run_test_tty_file_cold_3();
LAB_001861df:
    run_test_tty_file_cold_5();
LAB_001861e4:
    run_test_tty_file_cold_4();
LAB_001861e9:
    run_test_tty_file_cold_6();
LAB_001861ee:
    run_test_tty_file_cold_7();
LAB_001861f3:
    run_test_tty_file_cold_8();
LAB_001861f8:
    run_test_tty_file_cold_9();
LAB_001861fd:
    run_test_tty_file_cold_10();
LAB_00186202:
    run_test_tty_file_cold_14();
LAB_00186207:
    run_test_tty_file_cold_13();
LAB_0018620c:
    run_test_tty_file_cold_15();
LAB_00186211:
    run_test_tty_file_cold_11();
LAB_00186216:
    run_test_tty_file_cold_16();
LAB_0018621b:
    run_test_tty_file_cold_12();
LAB_00186220:
    run_test_tty_file_cold_20();
LAB_00186225:
    run_test_tty_file_cold_17();
LAB_0018622a:
    run_test_tty_file_cold_21();
LAB_0018622f:
    run_test_tty_file_cold_18();
LAB_00186234:
    run_test_tty_file_cold_22();
LAB_00186239:
    run_test_tty_file_cold_19();
LAB_0018623e:
    run_test_tty_file_cold_23();
LAB_00186243:
    run_test_tty_file_cold_26();
LAB_00186248:
    run_test_tty_file_cold_24();
  }
  run_test_tty_file_cold_25();
  puVar4 = auStack_a68;
  puStack_718 = unaff_RBX;
  iVar1 = uv_loop_init(puVar4);
  if (iVar1 == 0) {
    iVar1 = openpty(&uStack_ce4,&uStack_ce8,0,0,auStack_ce0);
    if (iVar1 != 0) {
      run_test_tty_pty_cold_2();
      return 1;
    }
    puVar4 = auStack_a68;
    iVar1 = uv_tty_init(puVar4,auStack_cd8,uStack_ce8,0);
    if (iVar1 != 0) goto LAB_001863e8;
    puVar4 = auStack_a68;
    iVar1 = uv_tty_init(puVar4,auStack_ba0,uStack_ce4,0);
    if (iVar1 != 0) goto LAB_001863ed;
    puVar4 = auStack_cd8;
    iVar1 = uv_is_readable(puVar4);
    if (iVar1 == 0) goto LAB_001863f2;
    puVar4 = auStack_cd8;
    iVar1 = uv_is_writable(puVar4);
    if (iVar1 == 0) goto LAB_001863f7;
    puVar4 = auStack_ba0;
    iVar1 = uv_is_readable(puVar4);
    if (iVar1 == 0) goto LAB_001863fc;
    puVar4 = auStack_ba0;
    iVar1 = uv_is_writable(puVar4);
    if (iVar1 == 0) goto LAB_00186401;
    if ((bStack_c7e & 0x10) != 0) goto LAB_00186406;
    if ((bStack_b46 & 0x10) == 0) goto LAB_0018640b;
    puVar4 = (undefined1 *)(ulong)uStack_ce8;
    iVar1 = close(uStack_ce8);
    if (iVar1 != 0) goto LAB_00186410;
    uv_close(auStack_cd8,0);
    puVar4 = (undefined1 *)(ulong)uStack_ce4;
    iVar1 = close(uStack_ce4);
    if (iVar1 != 0) goto LAB_00186415;
    uv_close(auStack_ba0,0);
    puVar4 = auStack_a68;
    iVar1 = uv_run(puVar4,0);
    if (iVar1 == 0) {
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      puVar4 = (undefined1 *)uv_default_loop();
      iVar1 = uv_loop_close(puVar4);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0018641f;
    }
  }
  else {
    run_test_tty_pty_cold_1();
LAB_001863e8:
    run_test_tty_pty_cold_3();
LAB_001863ed:
    run_test_tty_pty_cold_4();
LAB_001863f2:
    run_test_tty_pty_cold_14();
LAB_001863f7:
    run_test_tty_pty_cold_13();
LAB_001863fc:
    run_test_tty_pty_cold_12();
LAB_00186401:
    run_test_tty_pty_cold_11();
LAB_00186406:
    run_test_tty_pty_cold_5();
LAB_0018640b:
    run_test_tty_pty_cold_10();
LAB_00186410:
    run_test_tty_pty_cold_6();
LAB_00186415:
    run_test_tty_pty_cold_7();
  }
  run_test_tty_pty_cold_8();
LAB_0018641f:
  run_test_tty_pty_cold_9();
  iVar1 = uv_is_closing();
  if (iVar1 == 0) {
    iVar1 = uv_close(puVar4,0);
    return iVar1;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(tty_file) {
#ifndef _WIN32
  uv_loop_t loop;
  uv_tty_t tty;
  uv_tty_t tty_ro;
  uv_tty_t tty_wo;
  int fd;

  ASSERT(0 == uv_loop_init(&loop));

  fd = open("test/fixtures/empty_file", O_RDONLY);
  if (fd != -1) {
    ASSERT(UV_EINVAL == uv_tty_init(&loop, &tty, fd, 1));
    ASSERT(0 == close(fd));
    /* test EBADF handling */
    ASSERT(UV_EINVAL == uv_tty_init(&loop, &tty, fd, 1));
  }

/* Bug on AIX where '/dev/random' returns 1 from isatty() */
#ifndef _AIX
  fd = open("/dev/random", O_RDONLY);
  if (fd != -1) {
    ASSERT(UV_EINVAL == uv_tty_init(&loop, &tty, fd, 1));
    ASSERT(0 == close(fd));
  }
#endif /* _AIX */

  fd = open("/dev/zero", O_RDONLY);
  if (fd != -1) {
    ASSERT(UV_EINVAL == uv_tty_init(&loop, &tty, fd, 1));
    ASSERT(0 == close(fd));
  }

  fd = open("/dev/tty", O_RDWR);
  if (fd != -1) {
    ASSERT(0 == uv_tty_init(&loop, &tty, fd, 1));
    ASSERT(0 == close(fd)); /* TODO: it's indeterminate who owns fd now */
    ASSERT(uv_is_readable((uv_stream_t*) &tty));
    ASSERT(uv_is_writable((uv_stream_t*) &tty));
    uv_close((uv_handle_t*) &tty, NULL);
    ASSERT(!uv_is_readable((uv_stream_t*) &tty));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty));
  }

  fd = open("/dev/tty", O_RDONLY);
  if (fd != -1) {
    ASSERT(0 == uv_tty_init(&loop, &tty_ro, fd, 1));
    ASSERT(0 == close(fd)); /* TODO: it's indeterminate who owns fd now */
    ASSERT(uv_is_readable((uv_stream_t*) &tty_ro));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty_ro));
    uv_close((uv_handle_t*) &tty_ro, NULL);
    ASSERT(!uv_is_readable((uv_stream_t*) &tty_ro));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty_ro));
  }

  fd = open("/dev/tty", O_WRONLY);
  if (fd != -1) {
    ASSERT(0 == uv_tty_init(&loop, &tty_wo, fd, 0));
    ASSERT(0 == close(fd)); /* TODO: it's indeterminate who owns fd now */
    ASSERT(!uv_is_readable((uv_stream_t*) &tty_wo));
    ASSERT(uv_is_writable((uv_stream_t*) &tty_wo));
    uv_close((uv_handle_t*) &tty_wo, NULL);
    ASSERT(!uv_is_readable((uv_stream_t*) &tty_wo));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty_wo));
  }


  ASSERT(0 == uv_run(&loop, UV_RUN_DEFAULT));
  ASSERT(0 == uv_loop_close(&loop));

  MAKE_VALGRIND_HAPPY();
#endif
  return 0;
}